

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O3

void __thiscall
booster::locale::util::gregorian_calendar::from_time(gregorian_calendar *this,time_t point)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  tm *ptVar11;
  runtime_error *this_00;
  time_t real_point;
  tm tmp_tm;
  long local_80;
  string local_78;
  tm local_58;
  
  local_80 = this->tzoff_ + point;
  if (this->is_local_ == true) {
    ptVar11 = localtime_r(&local_80,&local_58);
  }
  else {
    ptVar11 = gmtime_r(&local_80,&local_58);
  }
  if (ptVar11 != (tm *)0x0) {
    (this->tm_).tm_zone = ptVar11->tm_zone;
    iVar7 = ptVar11->tm_sec;
    iVar8 = ptVar11->tm_min;
    iVar9 = ptVar11->tm_hour;
    iVar10 = ptVar11->tm_mday;
    iVar3 = ptVar11->tm_mon;
    iVar4 = ptVar11->tm_year;
    iVar5 = ptVar11->tm_wday;
    iVar6 = ptVar11->tm_yday;
    uVar2 = *(undefined4 *)&ptVar11->field_0x24;
    lVar1 = ptVar11->tm_gmtoff;
    (this->tm_).tm_isdst = ptVar11->tm_isdst;
    *(undefined4 *)&(this->tm_).field_0x24 = uVar2;
    (this->tm_).tm_gmtoff = lVar1;
    (this->tm_).tm_mon = iVar3;
    (this->tm_).tm_year = iVar4;
    (this->tm_).tm_wday = iVar5;
    (this->tm_).tm_yday = iVar6;
    (this->tm_).tm_sec = iVar7;
    (this->tm_).tm_min = iVar8;
    (this->tm_).tm_hour = iVar9;
    (this->tm_).tm_mday = iVar10;
    iVar3 = ptVar11->tm_min;
    iVar4 = ptVar11->tm_hour;
    iVar5 = ptVar11->tm_mday;
    iVar6 = ptVar11->tm_mon;
    iVar7 = ptVar11->tm_year;
    iVar8 = ptVar11->tm_wday;
    iVar9 = ptVar11->tm_yday;
    iVar10 = ptVar11->tm_isdst;
    uVar2 = *(undefined4 *)&ptVar11->field_0x24;
    lVar1 = ptVar11->tm_gmtoff;
    (this->tm_updated_).tm_sec = ptVar11->tm_sec;
    (this->tm_updated_).tm_min = iVar3;
    (this->tm_updated_).tm_hour = iVar4;
    (this->tm_updated_).tm_mday = iVar5;
    (this->tm_updated_).tm_mon = iVar6;
    (this->tm_updated_).tm_year = iVar7;
    (this->tm_updated_).tm_wday = iVar8;
    (this->tm_updated_).tm_yday = iVar9;
    (this->tm_updated_).tm_isdst = iVar10;
    *(undefined4 *)&(this->tm_updated_).field_0x24 = uVar2;
    (this->tm_updated_).tm_gmtoff = lVar1;
    (this->tm_updated_).tm_zone = ptVar11->tm_zone;
    this->normalized_ = true;
    this->time_ = point;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"boost::locale::gregorian_calendar: invalid time point","");
  runtime_error::runtime_error(this_00,&local_78);
  *(undefined ***)this_00 = &PTR__runtime_error_001d1028;
  (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__date_time_error_001d1050;
  __cxa_throw(this_00,&date_time_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void from_time(std::time_t point)
        {
            std::time_t real_point = point + tzoff_;
            std::tm *t = 0;
            #ifdef BOOSTER_WIN_NATIVE
            // Windows uses TLS, thread safe
            t = is_local_ ? localtime(&real_point) : gmtime(&real_point);
            #else
            std::tm tmp_tm;
            t = is_local_ ? localtime_r(&real_point,&tmp_tm) : gmtime_r(&real_point,&tmp_tm);
            #endif
            if(!t) {
                throw date_time_error("boost::locale::gregorian_calendar: invalid time point");
            }
            tm_ = *t;
            tm_updated_ = *t;
            normalized_ = true;
            time_ = point;
        }